

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_Pair_resizeT(ImVector_Pair *self,int new_size,Pair v)

{
  ImGuiStoragePair local_10;
  
  local_10.field_1 = v.field_1;
  local_10.key = v.key;
  ImVector<ImGuiStorage::ImGuiStoragePair>::resize(self,new_size,&local_10);
  return;
}

Assistant:

CIMGUI_API void ImVector_Pair_resizeT(ImVector_Pair* self,int new_size,const Pair v)
{
    return self->resize(new_size,v);
}